

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcodeEan8.cpp
# Opt level: O0

uint32_t BarcodeEan8::intToBarcode(uint32_t value,uint8_t *barcode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  long lVar13;
  uint64_t helper;
  uint32_t remainder;
  uint32_t evenDigits;
  uint32_t oddDigits;
  uint8_t digit [8];
  uint8_t *barcode_local;
  uint32_t value_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)value / 1000000;
  bVar7 = SUB161(auVar1 % ZEXT816(10),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)value / 100000;
  bVar8 = SUB161(auVar2 % ZEXT816(10),0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (ulong)value / 10000;
  bVar9 = SUB161(auVar3 % ZEXT816(10),0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (ulong)value / 1000;
  bVar10 = SUB161(auVar4 % ZEXT816(10),0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (ulong)value / 100;
  bVar11 = SUB161(auVar5 % ZEXT816(10),0);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (ulong)value / 10;
  bVar12 = SUB161(auVar6 % ZEXT816(10),0);
  lVar13 = (((((((((ulong)"\r\x19\x13=#1/;7\v"[bVar7] | 0x280) << 7 |
                 (ulong)"\r\x19\x13=#1/;7\v"[bVar8]) << 7 | (ulong)"\r\x19\x13=#1/;7\v"[bVar9]) << 7
               | (ulong)"\r\x19\x13=#1/;7\v"[bVar10]) << 5 | 10) << 7 | (ulong)"rflB\\NPDHt"[bVar11]
             ) << 7 | (ulong)"rflB\\NPDHt"[bVar12]) << 7 | (ulong)"rflB\\NPDHt"[(ulong)value % 10])
           << 7;
  bVar7 = "rflB\\NPDHt"
          [(ulong)(10 - (((uint)(byte)((ulong)value % 10) + (uint)bVar11 + (uint)bVar9 + (uint)bVar7
                         ) * 3 + (uint)bVar12 + (uint)bVar10 + (uint)bVar8) % 10) % 10];
  *barcode = (uint8_t)((ulong)lVar13 >> 0x38);
  barcode[1] = (uint8_t)((ulong)lVar13 >> 0x30);
  barcode[2] = (uint8_t)((ulong)lVar13 >> 0x28);
  barcode[3] = (uint8_t)((ulong)lVar13 >> 0x20);
  barcode[4] = (uint8_t)((ulong)lVar13 >> 0x18);
  barcode[5] = (uint8_t)((ulong)lVar13 >> 0x10);
  barcode[6] = (uint8_t)((ulong)lVar13 >> 8);
  barcode[7] = (byte)lVar13 | bVar7;
  barcode[8] = 0xa0;
  return 0x43;
}

Assistant:

uint32_t BarcodeEan8::intToBarcode(const uint32_t value, uint8_t barcode[9])
{
   uint8_t digit[8];
   uint32_t oddDigits;
   uint32_t evenDigits;
   uint32_t remainder;
   uint64_t helper;

   //get 7 decimal digits
   digit[0] = (value / (1000000uL)) % 10;
   digit[1] = (value / (100000uL)) % 10;
   digit[2] = (value / (10000uL)) % 10;
   digit[3] = (value / (1000uL)) % 10;
   digit[4] = (value / (100uL)) % 10;
   digit[5] = (value / (10uL)) % 10;
   digit[6] = value % 10;

   //checksum digit
   oddDigits = digit[6] + digit[4] + digit[2] + digit[0];
   evenDigits = digit[5] + digit[3] + digit[1];
   remainder = ((3 * oddDigits + evenDigits) % 10);
   digit[7] = (uint8_t)((10 - remainder) % 10);

   //encode into barcode

   //use 64-bit helper variable
   //start marker
   helper = 0x05; //3bit
   //left digits
   helper = (helper << 7) | leftOddDigit[digit[0]];
   helper = (helper << 7) | leftOddDigit[digit[1]];
   helper = (helper << 7) | leftOddDigit[digit[2]];
   helper = (helper << 7) | leftOddDigit[digit[3]];
   //center marker
   helper = (helper << 5) | 0x0A; //5bit
   //right digits
   helper = (helper << 7) | rightDigit[digit[4]];
   helper = (helper << 7) | rightDigit[digit[5]];
   helper = (helper << 7) | rightDigit[digit[6]];
   helper = (helper << 7) | rightDigit[digit[7]];

   //copy into byte array
   barcode[0] = (uint8_t)(helper >> 56);
   barcode[1] = (uint8_t)(helper >> 48);
   barcode[2] = (uint8_t)(helper >> 40);
   barcode[3] = (uint8_t)(helper >> 32);
   barcode[4] = (uint8_t)(helper >> 24);
   barcode[5] = (uint8_t)(helper >> 16);
   barcode[6] = (uint8_t)(helper >> 8);
   barcode[7] = (uint8_t)helper;
   barcode[8] = 0x05 << 5; //add end marker


   //return length of barcode
   return (3 + 4*7 + 5 + 4*7 + 3); //3bit start, four 7-bit digits, 5 bit middle, 4 7-bit digits, 3bit end
}